

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

int msgbuf_write(msgbuf *msgbuf)

{
  int *piVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  cmsghdr *cmsg;
  msghdr msg;
  ssize_t n;
  uint i;
  ibuf *buf;
  iovec iov [1024];
  anon_union_24_2_43a74ec4 cmsgbuf;
  msgbuf *in_stack_ffffffffffffbf68;
  msgbuf *in_stack_ffffffffffffbf70;
  msghdr local_4088;
  ssize_t local_4050;
  uint local_4044;
  undefined8 *local_4040;
  iovec local_4038 [1024];
  undefined8 *local_30;
  int local_24;
  msgbuf local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4044 = 0;
  local_30 = in_RDI;
  memset(local_4038,0,0x4000);
  memset(&local_4088,0,0x38);
  local_4040 = (undefined8 *)*local_30;
  while ((local_4040 != (undefined8 *)0x0 && (local_4044 < 0x400))) {
    local_4038[local_4044].iov_base = (void *)(local_4040[2] + local_4040[6]);
    local_4038[local_4044].iov_len = local_4040[5] - local_4040[6];
    local_4044 = local_4044 + 1;
    if (*(int *)(local_4040 + 7) != -1) break;
    local_4040 = (undefined8 *)*local_4040;
  }
  local_4088.msg_iov = local_4038;
  local_4088.msg_iovlen = (size_t)local_4044;
  if ((local_4040 != (undefined8 *)0x0) && (*(int *)(local_4040 + 7) != -1)) {
    in_stack_ffffffffffffbf68 = &local_20;
    local_4088.msg_controllen = 0x18;
    local_20.bufs.tqh_first = (ibuf *)0x14;
    local_20.bufs.tqh_last._0_4_ = 1;
    local_20.bufs.tqh_last._4_4_ = 1;
    local_20.queued = *(u_int32_t *)(local_4040 + 7);
    in_stack_ffffffffffffbf70 = in_stack_ffffffffffffbf68;
    local_4088.msg_control = in_stack_ffffffffffffbf68;
  }
  do {
    local_4050 = sendmsg(*(int *)((long)local_30 + 0x14),&local_4088,0);
    if (local_4050 != -1) {
      if (local_4050 == 0) {
        piVar1 = __errno_location();
        *piVar1 = 0;
        local_24 = 0;
      }
      else {
        if ((local_4040 != (undefined8 *)0x0) && (*(int *)(local_4040 + 7) != -1)) {
          close(*(int *)(local_4040 + 7));
          *(undefined4 *)(local_4040 + 7) = 0xffffffff;
        }
        msgbuf_drain(in_stack_ffffffffffffbf70,(size_t)in_stack_ffffffffffffbf68);
        local_24 = 1;
      }
      goto LAB_00108e6f;
    }
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  piVar1 = __errno_location();
  if (*piVar1 == 0x69) {
    piVar1 = __errno_location();
    *piVar1 = 0xb;
  }
  local_24 = -1;
LAB_00108e6f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int
msgbuf_write(struct msgbuf *msgbuf)
{
	struct iovec	 iov[IOV_MAX];
	struct ibuf	*buf;
	unsigned int	 i = 0;
	ssize_t		 n;
	struct msghdr	 msg;
	struct cmsghdr	*cmsg;
	union {
		struct cmsghdr	hdr;
		char		buf[CMSG_SPACE(sizeof(int))];
	} cmsgbuf;

	bzero(&iov, sizeof(iov));
	bzero(&msg, sizeof(msg));
	TAILQ_FOREACH(buf, &msgbuf->bufs, entry) {
		if (i >= IOV_MAX)
			break;
		iov[i].iov_base = buf->buf + buf->rpos;
		iov[i].iov_len = buf->wpos - buf->rpos;
		i++;
		if (buf->fd != -1)
			break;
	}

	msg.msg_iov = iov;
	msg.msg_iovlen = i;

	if (buf != NULL && buf->fd != -1) {
		msg.msg_control = (caddr_t)&cmsgbuf.buf;
		msg.msg_controllen = sizeof(cmsgbuf.buf);
		cmsg = CMSG_FIRSTHDR(&msg);
		cmsg->cmsg_len = CMSG_LEN(sizeof(int));
		cmsg->cmsg_level = SOL_SOCKET;
		cmsg->cmsg_type = SCM_RIGHTS;
		*(int *)CMSG_DATA(cmsg) = buf->fd;
	}

again:
	if ((n = sendmsg(msgbuf->fd, &msg, 0)) == -1) {
		if (errno == EINTR)
			goto again;
		if (errno == ENOBUFS)
			errno = EAGAIN;
		return (-1);
	}

	if (n == 0) {			/* connection closed */
		errno = 0;
		return (0);
	}

	/*
	 * assumption: fd got sent if sendmsg sent anything
	 * this works because fds are passed one at a time
	 */
	if (buf != NULL && buf->fd != -1) {
		close(buf->fd);
		buf->fd = -1;
	}

	msgbuf_drain(msgbuf, n);

	return (1);
}